

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::MergeFrom(MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
            *this,MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                  *other)

{
  bool bVar1;
  const_pointer pvVar2;
  key_arg<std::__cxx11::basic_string<char>_> *key;
  Argument *this_00;
  const_iterator local_48;
  undefined1 local_30 [8];
  const_iterator it;
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *other_local;
  MapFieldLite<CoreML::Specification::MILSpec::Operation_InputsEntry_DoNotUse,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_local;
  
  it.it_.bucket_index_ = (size_type)other;
  Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
  ::begin((const_iterator *)local_30,&other->map_);
  while( true ) {
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
    ::end(&local_48,
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
           *)it.it_.bucket_index_);
    bVar1 = protobuf::operator!=((const_iterator *)local_30,&local_48);
    if (!bVar1) break;
    pvVar2 = Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
             ::const_iterator::operator->((const_iterator *)local_30);
    key = (key_arg<std::__cxx11::basic_string<char>_> *)
          Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
          ::const_iterator::operator->((const_iterator *)local_30);
    this_00 = Map<std::__cxx11::string,CoreML::Specification::MILSpec::Argument>::
              operator[]<std::__cxx11::string>
                        ((Map<std::__cxx11::string,CoreML::Specification::MILSpec::Argument> *)this,
                         key);
    CoreML::Specification::MILSpec::Argument::operator=(this_00,(Argument *)(pvVar2 + 0x20));
    Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Argument>
    ::const_iterator::operator++((const_iterator *)local_30);
  }
  return;
}

Assistant:

void MergeFrom(const MapFieldLite& other) {
    for (typename Map<Key, T>::const_iterator it = other.map_.begin();
         it != other.map_.end(); ++it) {
      map_[it->first] = it->second;
    }
  }